

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_labelf(nk_context *ctx,nk_flags flags,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1f8 [24];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined1 local_148 [8];
  va_list args;
  char local_128 [8];
  char buf [256];
  char *fmt_local;
  nk_flags flags_local;
  nk_context *ctx_local;
  
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Qa;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_1f8;
  args[0]._0_8_ = &stack0x00000008;
  local_148._4_4_ = 0x30;
  local_148._0_4_ = 0x18;
  local_1e0 = in_RCX;
  local_1d8 = in_R8;
  local_1d0 = in_R9;
  nk_strfmt(local_128,0x100,fmt,(__va_list_tag *)local_148);
  nk_label(ctx,local_128,flags);
  return;
}

Assistant:

NK_API void
nk_labelf(struct nk_context *ctx, nk_flags flags, const char *fmt, ...)
{
    char buf[256];
    va_list args;
    va_start(args, fmt);
    nk_strfmt(buf, NK_LEN(buf), fmt, args);
    nk_label(ctx, buf, flags);
    va_end(args);
}